

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O0

size_t nni_strlcpy(char *dst,char *src,size_t len)

{
  char cVar1;
  ulong uVar2;
  ulong uStack_28;
  char c;
  size_t n;
  size_t len_local;
  char *src_local;
  char *dst_local;
  
  uStack_28 = 0;
  uVar2 = uStack_28;
  len_local = (size_t)src;
  src_local = dst;
  do {
    uStack_28 = uVar2;
    cVar1 = *(char *)len_local;
    uVar2 = uStack_28 + 1;
    if (uVar2 < len) {
      *src_local = cVar1;
      src_local = src_local + 1;
    }
    else if (uVar2 == len) {
      *src_local = '\0';
    }
    len_local = len_local + 1;
  } while (cVar1 != '\0');
  return uStack_28;
}

Assistant:

size_t
nni_strlcpy(char *dst, const char *src, size_t len)
{
#ifdef NNG_HAVE_STRLCPY
	return (strlcpy(dst, src, len));
#else
	size_t n;
	char   c;

	n = 0;
	do {
		c = *src++;
		n++;
		if (n < len) {
			*dst++ = c;
		} else if (n == len) {
			*dst = '\0';
		}
	} while (c);
	return (n - 1);
#endif
}